

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void cmDependsFortranParser_RuleDefine(cmDependsFortranParser *parser,char *macro)

{
  allocator local_39;
  value_type local_38;
  char *local_18;
  char *macro_local;
  cmDependsFortranParser *parser_local;
  
  if (parser->InPPFalseBranch == 0) {
    local_18 = macro;
    macro_local = (char *)parser;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,macro,&local_39);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&parser->PPDefinitions,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void cmDependsFortranParser_RuleDefine(cmDependsFortranParser* parser,
                                       const char* macro)
{
  if(!parser->InPPFalseBranch)
    {
    parser->PPDefinitions.insert(macro);
    }
}